

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O2

void __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::VIAPortHandler::
set_control_line_output(VIAPortHandler *this,Port port,Line line,bool value)

{
  Logger<(Log::Source)17> local_20 [8];
  
  if (line == Two && port == B) {
    Macintosh::Keyboard::set_input(this->keyboard_,value);
    return;
  }
  Log::Logger<(Log::Source)17>::error(local_20);
  Log::Logger<(Log::Source)17>::LogLine::append
            ((LogLine *)local_20,"Unhandled 6522 control line output: %c%d",
             (ulong)(0x42 - (port == A)),(ulong)line);
  Log::Logger<(Log::Source)17>::LogLine::~LogLine((LogLine *)local_20);
  return;
}

Assistant:

void set_control_line_output(Port port, Line line, bool value) {
					/*
						Keyboard wiring (I believe):
						CB2 = data		(input/output)
						CB1 = clock		(input)

						CA2 is used for receiving RTC interrupts.
						CA1 is used for receiving vsync.
					*/
					if(port == Port::B && line == Line::Two) {
						keyboard_.set_input(value);
					}
					else logger.error().append("Unhandled 6522 control line output: %c%d", port ? 'B' : 'A', int(line));
				}